

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_Nls(ARKodeMem ark_mem,int nflag)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int in_ESI;
  ARKodeMem in_RDI;
  double dVar4;
  int retval;
  long nls_fails_inc;
  long nls_iters_inc;
  int callLSetup;
  ARKodeMRIStepMem step_mem;
  bool local_40;
  bool local_3f;
  long local_38;
  long local_30;
  uint local_24;
  void *local_20;
  ARKodeMem local_10;
  int local_4;
  
  local_30 = 0;
  local_38 = 0;
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x113,"mriStep_Nls",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep_nls.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_20 = in_RDI->step_mem;
    if (*(long *)((long)local_20 + 0x148) == 0) {
      *(undefined8 *)((long)local_20 + 0xf8) = 0x3ff0000000000000;
      local_24 = 0;
    }
    else {
      if (*(int *)((long)local_20 + 0x10) == 0) {
        uVar3 = 2;
        if (in_ESI == 6 || in_ESI == 8) {
          uVar3 = 0;
        }
        *(undefined4 *)((long)local_20 + 300) = uVar3;
      }
      else {
        uVar3 = 2;
        if (in_ESI == 6) {
          uVar3 = 0;
        }
        *(undefined4 *)((long)local_20 + 300) = uVar3;
      }
      bVar1 = true;
      if ((in_RDI->firststage == 0) && (bVar1 = true, -1 < *(int *)((long)local_20 + 0x118))) {
        dVar4 = ABS(*(double *)((long)local_20 + 0xd0) - 1.0);
        bVar1 = *(double *)((long)local_20 + 0xd8) <= dVar4 &&
                dVar4 != *(double *)((long)local_20 + 0xd8);
      }
      if (*(int *)((long)local_20 + 0x10) == 0) {
        local_40 = true;
        if (((!bVar1) && (local_40 = true, in_ESI != 7)) && (local_40 = true, in_ESI != 8)) {
          iVar2 = *(int *)((long)local_20 + 0x118);
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          local_40 = *(long *)((long)local_20 + 0x120) + (long)iVar2 <= in_RDI->nst;
        }
      }
      else {
        local_3f = true;
        local_40 = local_3f;
        if (!bVar1) {
          local_40 = *(int *)((long)local_20 + 0x14) != 0;
        }
      }
      local_24 = (uint)local_40;
    }
    local_10 = in_RDI;
    N_VConst(*(undefined8 *)((long)local_20 + 0x98));
    *(double *)((long)local_20 + 0x108) = *(double *)((long)local_20 + 0x110) * 0.1;
    iVar2 = SUNNonlinSolSolve(*(undefined8 *)((long)local_20 + 0x110),
                              *(undefined8 *)((long)local_20 + 0xa8),
                              *(undefined8 *)((long)local_20 + 0x90),
                              *(undefined8 *)((long)local_20 + 0x98),local_10->ewt,local_24,local_10
                             );
    SUNNonlinSolGetNumIters(*(undefined8 *)((long)local_20 + 0xa8),&local_30);
    *(long *)((long)local_20 + 0x1b0) = local_30 + *(long *)((long)local_20 + 0x1b0);
    SUNNonlinSolGetNumConvFails(*(undefined8 *)((long)local_20 + 0xa8),&local_38);
    *(long *)((long)local_20 + 0x1b8) = local_38 + *(long *)((long)local_20 + 0x1b8);
    if (iVar2 == 0) {
      *(undefined4 *)((long)local_20 + 0x130) = 0;
      N_VLinearSum(*(undefined8 *)((long)local_20 + 0x98),*(undefined8 *)((long)local_20 + 0x90),
                   local_10->ycur);
      local_4 = 0;
    }
    else {
      local_4 = iVar2;
      if (iVar2 == 0x386) {
        local_4 = 4;
      }
    }
  }
  return local_4;
}

Assistant:

int mriStep_Nls(ARKodeMem ark_mem, int nflag)
{
  ARKodeMRIStepMem step_mem;
  sunbooleantype callLSetup;
  long int nls_iters_inc = 0;
  long int nls_fails_inc = 0;
  int retval;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* If a linear solver 'setup' is supplied, set various flags for
     determining whether it should be called */
  if (step_mem->lsetup)
  {
    /* Set interface 'convfail' flag for use inside lsetup */
    if (step_mem->linear)
    {
      step_mem->convfail = (nflag == FIRST_CALL) ? ARK_NO_FAILURES
                                                 : ARK_FAIL_OTHER;
    }
    else
    {
      step_mem->convfail = ((nflag == FIRST_CALL) || (nflag == PREV_ERR_FAIL))
                             ? ARK_NO_FAILURES
                             : ARK_FAIL_OTHER;
    }

    /* Decide whether to recommend call to lsetup within nonlinear solver */
    callLSetup = (ark_mem->firststage) || (step_mem->msbp < 0) ||
                 (SUNRabs(step_mem->gamrat - ONE) > step_mem->dgmax);
    if (step_mem->linear)
    { /* linearly-implicit problem */
      callLSetup = callLSetup || (step_mem->linear_timedep);
    }
    else
    { /* nonlinearly-implicit problem */
      callLSetup = callLSetup || (nflag == PREV_CONV_FAIL) ||
                   (nflag == PREV_ERR_FAIL) ||
                   (ark_mem->nst >= step_mem->nstlp + abs(step_mem->msbp));
    }
  }
  else
  {
    step_mem->crate = ONE;
    callLSetup      = SUNFALSE;
  }

  /* set a zero guess for correction */
  N_VConst(ZERO, step_mem->zcor);

  /* Reset the stored residual norm (for iterative linear solvers) */
  step_mem->eRNrm = SUN_RCONST(0.1) * step_mem->nlscoef;

  SUNLogInfo(ARK_LOGGER, "begin-nonlinear-solve", "tol = %.16g",
             step_mem->nlscoef);

  /* solve the nonlinear system for the actual correction */
  retval = SUNNonlinSolSolve(step_mem->NLS, step_mem->zpred, step_mem->zcor,
                             ark_mem->ewt, step_mem->nlscoef, callLSetup,
                             ark_mem);

  SUNLogExtraDebugVec(ARK_LOGGER, "correction", step_mem->zcor, "zcor(:) =");

  /* increment counters */
  (void)SUNNonlinSolGetNumIters(step_mem->NLS, &nls_iters_inc);
  step_mem->nls_iters += nls_iters_inc;

  (void)SUNNonlinSolGetNumConvFails(step_mem->NLS, &nls_fails_inc);
  step_mem->nls_fails += nls_fails_inc;

  /* successful solve -- reset the jcur flag and apply correction */
  if (retval == SUN_SUCCESS)
  {
    step_mem->jcur = SUNFALSE;
    N_VLinearSum(ONE, step_mem->zcor, ONE, step_mem->zpred, ark_mem->ycur);

    SUNLogInfo(ARK_LOGGER, "end-nonlinear-solve",
               "status = success, iters = %li", nls_iters_inc);
    return (ARK_SUCCESS);
  }

  SUNLogInfo(ARK_LOGGER, "end-nonlinear-solve",
             "status = failed, retval = %i, iters = %li", retval, nls_iters_inc);

  /* check for recoverable failure, return ARKODE::CONV_FAIL */
  if (retval == SUN_NLS_CONV_RECVR) { return (CONV_FAIL); }

  return (retval);
}